

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::showHelp(Session *this)

{
  ostream *poVar1;
  Parser *parser;
  ostream *poVar2;
  ostream *in_RDI;
  
  poVar1 = cout();
  parser = (Parser *)std::operator<<((ostream *)poVar1,"\nCatch v");
  libraryVersion();
  poVar1 = Catch::operator<<(in_RDI,(Version *)parser);
  std::operator<<((ostream *)poVar1,anon_var_dwarf_65e82c + 8);
  poVar1 = clara::detail::operator<<(in_RDI,parser);
  poVar2 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"For more detailed usage please see the project docs\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Session::showHelp() const {
        Catch::cout()
                << "\nCatch v" << libraryVersion() << "\n"
                << m_cli << std::endl
                << "For more detailed usage please see the project docs\n" << std::endl;
    }